

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O0

void compact_upto_test(bool multi_kv)

{
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  uint64_t *in_stack_00000ac8;
  fdb_snapshot_info_t **in_stack_00000ad0;
  fdb_file_handle *in_stack_00000ad8;
  void *pvVar5;
  fdb_kvs_handle *in_stack_fffffffffffff968;
  fdb_file_handle *in_stack_fffffffffffff970;
  fdb_snapshot_info_t *in_stack_fffffffffffff978;
  size_t in_stack_fffffffffffff990;
  undefined8 local_5f8 [5];
  undefined1 *local_5d0;
  char *local_5c8;
  size_t local_5c0;
  char *local_5b8;
  size_t local_5b0;
  char *local_5a8;
  undefined1 *local_5a0;
  char *local_598;
  size_t local_590;
  char *local_588;
  size_t local_580;
  char *local_578;
  int local_56c;
  undefined1 *local_568;
  char *local_560;
  size_t local_558;
  char *local_550;
  size_t local_548;
  char *local_540;
  int local_534;
  undefined1 *local_530;
  char *local_528;
  size_t local_520;
  char *local_518;
  size_t local_510;
  char *local_508;
  int local_4fc;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char compact_filename [32];
  char local_3c0 [8];
  char kv_name [8];
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  ulong local_b0;
  uint64_t num_markers;
  fdb_kvs_handle *snapshot;
  fdb_snapshot_info_t *markers;
  fdb_status status;
  fdb_doc **doc;
  fdb_kvs_handle **db;
  fdb_file_handle *dbfile;
  int num_kvs;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  bool multi_kv_local;
  
  local_5f8[3] = 0x108a50;
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  local_5f8[3] = 0x108a5d;
  memleak_start();
  dbfile._0_4_ = 4;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 0x400;
  fconfig.purging_interval = 1;
  fconfig.flags._3_1_ = 0;
  fconfig.encryption_key.bytes[0x1c] = '\0';
  fconfig.encryption_key.bytes[0x1d] = '\0';
  fconfig.encryption_key.bytes[0x1e] = '\0';
  fconfig.encryption_key.bytes[0x1f] = '\0';
  fconfig._180_4_ = 0;
  fconfig.compactor_sleep_duration._0_1_ = multi_kv;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_open((fdb_file_handle **)fconfig.max_writer_lock_prob,(char *)fconfig.compaction_cb_ctx,
           (fdb_config *)fconfig._96_8_);
  if (multi_kv) {
    for (num_kvs = 0; num_kvs < 4; num_kvs = num_kvs + 1) {
      sprintf(local_3c0,"kv%d",(ulong)(uint)num_kvs);
      fdb_kvs_open((fdb_file_handle *)fconfig._0_8_,(fdb_kvs_handle **)kvs_config.custom_cmp_param,
                   (char *)kvs_config.custom_cmp,(fdb_kvs_config *)kvs_config._0_8_);
    }
  }
  else {
    dbfile._0_4_ = 1;
    fdb_kvs_open_default
              (in_stack_fffffffffffff970,(fdb_kvs_handle **)in_stack_fffffffffffff968,
               (fdb_kvs_config *)0x108b9e);
  }
  for (n = 0; local_4fc = n, n < 5; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf(kv_name,"body%d",(ulong)(uint)n);
    local_530 = &stack0xfffffffffffff968 + (long)n * 8;
    local_528 = metabuf + 0xf8;
    local_520 = strlen(metabuf + 0xf8);
    local_518 = bodybuf + 0xf8;
    local_510 = strlen(bodybuf + 0xf8);
    local_508 = kv_name;
    pvVar5 = (void *)0x108c86;
    sVar3 = strlen(kv_name);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff978,in_stack_fffffffffffff970,
                   (size_t)in_stack_fffffffffffff968,pvVar5,sVar3,(void *)0x108cbd,
                   in_stack_fffffffffffff990);
    for (num_kvs = 0; num_kvs < (int)dbfile; num_kvs = num_kvs + 1) {
      fdb_set((fdb_kvs_handle *)local_5f8[num_kvs],
              *(fdb_doc **)(&stack0xfffffffffffff968 + (long)n * 8));
    }
  }
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff968,'\0');
  for (; local_534 = n, n < 10; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf(kv_name,"body%d",(ulong)(uint)n);
    local_568 = &stack0xfffffffffffff968 + (long)n * 8;
    local_560 = metabuf + 0xf8;
    local_558 = strlen(metabuf + 0xf8);
    local_550 = bodybuf + 0xf8;
    local_548 = strlen(bodybuf + 0xf8);
    local_540 = kv_name;
    pvVar5 = (void *)0x108dfa;
    sVar3 = strlen(kv_name);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff978,in_stack_fffffffffffff970,
                   (size_t)in_stack_fffffffffffff968,pvVar5,sVar3,(void *)0x108e31,
                   in_stack_fffffffffffff990);
    for (num_kvs = 0; num_kvs < (int)dbfile; num_kvs = num_kvs + 1) {
      fdb_set((fdb_kvs_handle *)local_5f8[num_kvs],
              *(fdb_doc **)(&stack0xfffffffffffff968 + (long)n * 8));
    }
  }
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff968,'\0');
  for (; local_56c = n, n < 0xf; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf(kv_name,"body%d",(ulong)(uint)n);
    local_5a0 = &stack0xfffffffffffff968 + (long)n * 8;
    local_598 = metabuf + 0xf8;
    local_590 = strlen(metabuf + 0xf8);
    local_588 = bodybuf + 0xf8;
    local_580 = strlen(bodybuf + 0xf8);
    local_578 = kv_name;
    pvVar5 = (void *)0x108f7a;
    sVar3 = strlen(kv_name);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff978,in_stack_fffffffffffff970,
                   (size_t)in_stack_fffffffffffff968,pvVar5,sVar3,(void *)0x108fb1,
                   in_stack_fffffffffffff990);
    for (num_kvs = 0; num_kvs < (int)dbfile; num_kvs = num_kvs + 1) {
      fdb_set((fdb_kvs_handle *)local_5f8[num_kvs],
              *(fdb_doc **)(&stack0xfffffffffffff968 + (long)n * 8));
    }
  }
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff968,'\0');
  for (; n < 0x14; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf(kv_name,"body%d",(ulong)(uint)n);
    local_5d0 = &stack0xfffffffffffff968 + (long)n * 8;
    local_5c8 = metabuf + 0xf8;
    local_5c0 = strlen(metabuf + 0xf8);
    local_5b8 = bodybuf + 0xf8;
    local_5b0 = strlen(bodybuf + 0xf8);
    local_5a8 = kv_name;
    pvVar5 = (void *)0x1090d6;
    sVar3 = strlen(kv_name);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff978,in_stack_fffffffffffff970,
                   (size_t)in_stack_fffffffffffff968,pvVar5,sVar3,(void *)0x10910d,
                   in_stack_fffffffffffff990);
    for (num_kvs = 0; num_kvs < (int)dbfile; num_kvs = num_kvs + 1) {
      fdb_set((fdb_kvs_handle *)local_5f8[num_kvs],
              *(fdb_doc **)(&stack0xfffffffffffff968 + (long)n * 8));
    }
  }
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff968,'\0');
  for (num_kvs = 0; num_kvs < (int)dbfile; num_kvs = num_kvs + 1) {
    fVar1 = fdb_set_log_callback
                      ((fdb_kvs_handle *)local_5f8[num_kvs],logCallbackFunc,"compact_upto_test");
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x3f5);
      compact_upto_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x3f5,"void compact_upto_test(bool)");
      }
    }
  }
  fVar1 = fdb_get_all_snap_markers(in_stack_00000ad8,in_stack_00000ad0,in_stack_00000ac8);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x3f9);
    compact_upto_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x3f9,"void compact_upto_test(bool)");
    }
  }
  if (multi_kv) {
    if (local_b0 != 8) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x40e);
      compact_upto_test::__test_pass = 0;
      if (local_b0 != 8) {
        __assert_fail("num_markers == 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x40e,"void compact_upto_test(bool)");
      }
    }
    for (num_kvs = 0; num_kvs < (int)dbfile; num_kvs = num_kvs + 1) {
      if ((&snapshot->kvs_config)[num_kvs].custom_cmp !=
          (fdb_custom_cmp_variable)(long)((int)dbfile + 1)) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x410);
        compact_upto_test::__test_pass = 0;
        if ((&snapshot->kvs_config)[num_kvs].custom_cmp !=
            (fdb_custom_cmp_variable)(long)((int)dbfile + 1)) {
          __assert_fail("markers[r].num_kvs_markers == num_kvs+1",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x410,"void compact_upto_test(bool)");
        }
      }
      for (n = 0; n < (int)dbfile; n = n + 1) {
        if (*(long *)((long)(&snapshot->kvs_config)[num_kvs].custom_cmp_param + (long)n * 0x10 + 8)
            != (long)(num_kvs * -5 + 0x14)) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x413);
          compact_upto_test::__test_pass = 0;
          if (*(long *)((long)(&snapshot->kvs_config)[num_kvs].custom_cmp_param + (long)n * 0x10 + 8
                       ) != (long)(num_kvs * -5 + 0x14)) {
            __assert_fail("markers[r].kvs_markers[i].seqnum == (fdb_seqnum_t)(n - r*5)",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0x413,"void compact_upto_test(bool)");
          }
        }
        sprintf(local_3c0,"kv%d",(ulong)(uint)n);
        iVar2 = memcmp(*(void **)((long)(&snapshot->kvs_config)[num_kvs].custom_cmp_param +
                                 (long)n * 0x10),local_3c0,3);
        if (iVar2 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_3c0,
                  *(undefined8 *)
                   ((long)(&snapshot->kvs_config)[num_kvs].custom_cmp_param + (long)n * 0x10),
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x415);
          compact_upto_test::__test_pass = 0;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x415,"void compact_upto_test(bool)");
        }
      }
    }
    sprintf((char *)&fconfig.num_blocks_readahead,"compact_test_compact%d",1);
    fVar1 = fdb_compact_upto(in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,0x1098c1);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x41c);
      compact_upto_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x41c,"void compact_upto_test(bool)");
      }
    }
    fVar1 = fdb_snapshot_open((fdb_kvs_handle *)compact_filename._0_8_,
                              (fdb_kvs_handle **)fconfig._240_8_,fconfig._232_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x420);
      compact_upto_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x420,"void compact_upto_test(bool)");
      }
    }
    fdb_kvs_close(in_stack_fffffffffffff968);
  }
  else {
    if (local_b0 != 4) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x3fc);
      compact_upto_test::__test_pass = 0;
      if (local_b0 != 4) {
        __assert_fail("num_markers == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x3fc,"void compact_upto_test(bool)");
      }
    }
    for (num_kvs = 0; (ulong)(long)num_kvs < local_b0; num_kvs = num_kvs + 1) {
      if ((&snapshot->kvs_config)[num_kvs].custom_cmp != (fdb_custom_cmp_variable)0x1) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x3fe);
        compact_upto_test::__test_pass = 0;
        if ((&snapshot->kvs_config)[num_kvs].custom_cmp != (fdb_custom_cmp_variable)0x1) {
          __assert_fail("markers[r].num_kvs_markers == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x3fe,"void compact_upto_test(bool)");
        }
      }
      if (*(long *)((long)(&snapshot->kvs_config)[num_kvs].custom_cmp_param + 8) !=
          (long)(num_kvs * -5 + 0x14)) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x400);
        compact_upto_test::__test_pass = 0;
        if (*(long *)((long)(&snapshot->kvs_config)[num_kvs].custom_cmp_param + 8) !=
            (long)(num_kvs * -5 + 0x14)) {
          __assert_fail("markers[r].kvs_markers[0].seqnum == (fdb_seqnum_t)(n - r*5)",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x400,"void compact_upto_test(bool)");
        }
      }
    }
    sprintf((char *)&fconfig.num_blocks_readahead,"compact_test_compact%d",1);
    fVar1 = fdb_compact_upto(in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,0x109496);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x406);
      compact_upto_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x406,"void compact_upto_test(bool)");
      }
    }
    fVar1 = fdb_snapshot_open((fdb_kvs_handle *)compact_filename._0_8_,
                              (fdb_kvs_handle **)fconfig._240_8_,fconfig._232_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x40a);
      compact_upto_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x40a,"void compact_upto_test(bool)");
      }
    }
    fdb_kvs_close(in_stack_fffffffffffff968);
  }
  fVar1 = fdb_free_snap_markers(in_stack_fffffffffffff978,(uint64_t)in_stack_fffffffffffff970);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x426);
    compact_upto_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x426,"void compact_upto_test(bool)");
    }
  }
  fdb_close((fdb_file_handle *)in_stack_fffffffffffff968);
  for (n = 0; n < 0x14; n = n + 1) {
    fdb_doc_free((fdb_doc *)0x109a84);
  }
  fdb_shutdown();
  memleak_end();
  pcVar4 = "single kv mode:";
  if (multi_kv) {
    pcVar4 = "multiple kv mode:";
  }
  sprintf(kv_name,"compact upto marker in file test %s",pcVar4);
  if (compact_upto_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n",kv_name);
  }
  else {
    fprintf(_stderr,"%s PASSED\n",kv_name);
  }
  return;
}

Assistant:

void compact_upto_test(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 20;
    int num_kvs = 4; // keep this the same as number of fdb_commit() calls
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle *, num_kvs);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_status status;
    fdb_snapshot_info_t *markers;
    fdb_kvs_handle *snapshot;
    uint64_t num_markers;

    char keybuf[256], metabuf[256], bodybuf[256];
    char kv_name[8];
    char compact_filename[32];

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;
    // since this test requires static number of markers,
    // disable block reusing
    fconfig.block_reusing_threshold = 0;

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    if (multi_kv) {
        for (r = 0; r < num_kvs; ++r) {
            sprintf(kv_name, "kv%d", r);
            fdb_kvs_open(dbfile, &db[r], kv_name, &kvs_config);
        }
    } else {
        num_kvs = 1;
        fdb_kvs_open_default(dbfile, &db[0], &kvs_config);
    }

   // ------- Setup test ----------------------------------
   // insert documents of 0-4
    for (i=0; i<n/4; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit with a manual WAL flush (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 5 - 9
    for (; i < n/2; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit again without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // insert documents from 10-14 into HB-trie
    for (; i < (n/2 + n/4); i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 15 - 19 on file into the WAL
    for (; i < n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // commit without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    for (r = 0; r < num_kvs; ++r) {
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                                      (void *) "compact_upto_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    status = fdb_get_all_snap_markers(dbfile, &markers, &num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    if (!multi_kv) {
        TEST_CHK(num_markers == 4);
        for (r = 0; (uint64_t)r < num_markers; ++r) {
            TEST_CHK(markers[r].num_kvs_markers == 1);
            TEST_CHK(markers[r].kvs_markers[0].seqnum ==
                     (fdb_seqnum_t)(n - r*5));
        }
        r = 1; // Test compacting upto sequence number 15
        sprintf(compact_filename, "compact_test_compact%d", r);
        status = fdb_compact_upto(dbfile, compact_filename,
                                  markers[r].marker);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        // create a snapshot
        status = fdb_snapshot_open(db[0], &snapshot,
                                   markers[r].kvs_markers[0].seqnum);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        // close snapshot
        fdb_kvs_close(snapshot);
    } else {
        TEST_CHK(num_markers == 8);
        for (r = 0; r < num_kvs; ++r) {
            TEST_CHK(markers[r].num_kvs_markers == num_kvs+1);
            for (i = 0; i < num_kvs; ++i) {
                TEST_CHK(markers[r].kvs_markers[i].seqnum
                         == (fdb_seqnum_t)(n - r*5));
                sprintf(kv_name, "kv%d", i);
                TEST_CMP(markers[r].kvs_markers[i].kv_store_name, kv_name, 3);
            }
        }
        i = r = 1;
        sprintf(compact_filename, "compact_test_compact%d", i);
        status = fdb_compact_upto(dbfile, compact_filename,
                markers[i].marker);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        // create a snapshot
        status = fdb_snapshot_open(db[r], &snapshot,
                markers[i].kvs_markers[r].seqnum);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        // close snapshot
        fdb_kvs_close(snapshot);
    }

    status = fdb_free_snap_markers(markers, num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf, "compact upto marker in file test %s", multi_kv ?
                                                           "multiple kv mode:"
                                                         : "single kv mode:");
    TEST_RESULT(bodybuf);
}